

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void Predict(string *test_file,string *predict_file)

{
  int iVar1;
  clock_t cVar2;
  int i;
  int i_1;
  ulong uVar3;
  int local_90;
  int cnt_per_thread;
  clock_t local_88;
  string *local_80;
  vector<char,_std::allocator<char>_> *local_78;
  char *buf;
  vector<std::thread,_std::allocator<std::thread>_> thread_vec;
  vector<char,_std::allocator<char>_> res;
  
  local_80 = predict_file;
  local_88 = clock();
  iVar1 = open((test_file->_M_dataplus)._M_p,0);
  buf = (char *)mmap((void *)0x0,120000000,1,2,iVar1,0);
  madvise(buf,120000000,2);
  close(iVar1);
  thread_vec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(thread_vec.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,0x31);
  std::vector<char,_std::allocator<char>_>::vector
            (&res,20000,(value_type_conflict1 *)&thread_vec,(allocator_type *)&local_78);
  cnt_per_thread = 0x9c4;
  thread_vec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  thread_vec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  thread_vec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar1 = 0; iVar1 != 8; iVar1 = iVar1 + 1) {
    local_90 = cnt_per_thread * iVar1;
    local_78 = &res;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(char*,int,int,std::vector<char,std::allocator<char>>&),char*&,int,int&,std::reference_wrapper<std::vector<char,std::allocator<char>>>>
              ((vector<std::thread,std::allocator<std::thread>> *)&thread_vec,JudgePart,&buf,
               &local_90,&cnt_per_thread,
               (reference_wrapper<std::vector<char,_std::allocator<char>_>_> *)&local_78);
  }
  for (uVar3 = 0;
      uVar3 < (ulong)((long)thread_vec.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)thread_vec.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    std::thread::join();
  }
  cVar2 = clock();
  printf(anon_var_dwarf_9445,(double)(cVar2 - local_88) / 1000000.0);
  StorePredict(&res,local_80);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&thread_vec);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&res.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void Predict (const string & test_file, const string & predict_file) {
#ifdef TEST
    clock_t start_time = clock();
#endif

    int fd = open(test_file.c_str(), O_RDONLY);
    char * buf = (char *) mmap(NULL, 120000000, PROT_READ, MAP_PRIVATE, fd, 0);
    madvise(buf, 120000000, MADV_SEQUENTIAL);
    close(fd);

    vector<char> res(20000, '1');

    int thread_num = 8;
    int cnt_per_thread = 20000 / thread_num;
    vector<thread> thread_vec;
    for (int i = 0; i < thread_num; i++) {
        thread_vec.emplace_back(JudgePart, buf, i * cnt_per_thread, cnt_per_thread, ref(res));
    }

    for (int i = 0; i < thread_vec.size(); i++) {
        thread_vec[i].join();
    }

#ifdef TEST
    clock_t end_time = clock();
    printf("预测耗时（s）: %f \n", (double) (end_time - start_time) / CLOCKS_PER_SEC);
#endif

    StorePredict(res, predict_file);
}